

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_compose_transform(ALLEGRO_TRANSFORM *trans,ALLEGRO_TRANSFORM *other)

{
  float *in_RSI;
  float *in_RDI;
  ALLEGRO_TRANSFORM tmp;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  local_50 = in_RSI[0xc] * in_RDI[3] +
             in_RSI[8] * in_RDI[2] + *in_RSI * *in_RDI + in_RSI[4] * in_RDI[1];
  local_4c = in_RSI[0xd] * in_RDI[3] +
             in_RSI[9] * in_RDI[2] + in_RSI[1] * *in_RDI + in_RSI[5] * in_RDI[1];
  local_48 = in_RSI[0xe] * in_RDI[3] +
             in_RSI[10] * in_RDI[2] + in_RSI[2] * *in_RDI + in_RSI[6] * in_RDI[1];
  local_44 = in_RSI[0xf] * in_RDI[3] +
             in_RSI[0xb] * in_RDI[2] + in_RSI[3] * *in_RDI + in_RSI[7] * in_RDI[1];
  local_40 = in_RSI[0xc] * in_RDI[7] +
             in_RSI[8] * in_RDI[6] + *in_RSI * in_RDI[4] + in_RSI[4] * in_RDI[5];
  local_3c = in_RSI[0xd] * in_RDI[7] +
             in_RSI[9] * in_RDI[6] + in_RSI[1] * in_RDI[4] + in_RSI[5] * in_RDI[5];
  local_38 = in_RSI[0xe] * in_RDI[7] +
             in_RSI[10] * in_RDI[6] + in_RSI[2] * in_RDI[4] + in_RSI[6] * in_RDI[5];
  local_34 = in_RSI[0xf] * in_RDI[7] +
             in_RSI[0xb] * in_RDI[6] + in_RSI[3] * in_RDI[4] + in_RSI[7] * in_RDI[5];
  local_30 = in_RSI[0xc] * in_RDI[0xb] +
             in_RSI[8] * in_RDI[10] + *in_RSI * in_RDI[8] + in_RSI[4] * in_RDI[9];
  local_2c = in_RSI[0xd] * in_RDI[0xb] +
             in_RSI[9] * in_RDI[10] + in_RSI[1] * in_RDI[8] + in_RSI[5] * in_RDI[9];
  local_28 = in_RSI[0xe] * in_RDI[0xb] +
             in_RSI[10] * in_RDI[10] + in_RSI[2] * in_RDI[8] + in_RSI[6] * in_RDI[9];
  local_24 = in_RSI[0xf] * in_RDI[0xb] +
             in_RSI[0xb] * in_RDI[10] + in_RSI[3] * in_RDI[8] + in_RSI[7] * in_RDI[9];
  local_20 = in_RSI[0xc] * in_RDI[0xf] +
             in_RSI[8] * in_RDI[0xe] + *in_RSI * in_RDI[0xc] + in_RSI[4] * in_RDI[0xd];
  local_1c = in_RSI[0xd] * in_RDI[0xf] +
             in_RSI[9] * in_RDI[0xe] + in_RSI[1] * in_RDI[0xc] + in_RSI[5] * in_RDI[0xd];
  local_18 = in_RSI[0xe] * in_RDI[0xf] +
             in_RSI[10] * in_RDI[0xe] + in_RSI[2] * in_RDI[0xc] + in_RSI[6] * in_RDI[0xd];
  local_14 = in_RSI[0xf] * in_RDI[0xf] +
             in_RSI[0xb] * in_RDI[0xe] + in_RSI[3] * in_RDI[0xc] + in_RSI[7] * in_RDI[0xd];
  memcpy(in_RDI,&local_50,0x40);
  return;
}

Assistant:

void al_compose_transform(ALLEGRO_TRANSFORM *trans, const ALLEGRO_TRANSFORM *other)
{
   #define E(x, y)                        \
      (other->m[0][y] * trans->m[x][0] +  \
       other->m[1][y] * trans->m[x][1] +  \
       other->m[2][y] * trans->m[x][2] +  \
       other->m[3][y] * trans->m[x][3])   \

   const ALLEGRO_TRANSFORM tmp = {{
      { E(0, 0), E(0, 1), E(0, 2), E(0, 3) },
      { E(1, 0), E(1, 1), E(1, 2), E(1, 3) },
      { E(2, 0), E(2, 1), E(2, 2), E(2, 3) },
      { E(3, 0), E(3, 1), E(3, 2), E(3, 3) }
   }};

   *trans = tmp;

   #undef E
}